

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int findCreateFileMode(char *zPath,int flags,mode_t *pMode)

{
  int rc;
  mode_t *pMode_local;
  int flags_local;
  char *zPath_local;
  
  if ((flags & 0x10U) == 0) {
    *pMode = 0x1a4;
  }
  else {
    *pMode = 0x180;
  }
  return 0;
}

Assistant:

static int findCreateFileMode(
  const char *zPath,              /* Path of file (possibly) being created */
  int flags,                      /* Flags passed as 4th argument to xOpen() */
  mode_t *pMode                   /* OUT: Permissions to open file with */
){
  int rc = UNQLITE_OK;             /* Return Code */
  if( flags & UNQLITE_OPEN_TEMP_DB ){
    *pMode = 0600;
     SXUNUSED(zPath);
  }else{
    *pMode = UNQLITE_DEFAULT_FILE_PERMISSIONS;
  }
  return rc;
}